

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O1

bool __thiscall
tchecker::syncprod::vloc_edges_iterator_t::operator==
          (vloc_edges_iterator_t *this,vloc_edges_iterator_t *it)

{
  bool bVar1;
  
  bVar1 = vloc_synchronized_edges_iterator_t::operator==(&this->_sync_it,&it->_sync_it);
  if ((((bVar1) &&
       ((this->_async_it)._it.super_type.m_iterator == (it->_async_it)._it.super_type.m_iterator))
      && ((this->_async_it)._end.super_type.m_iterator == (it->_async_it)._end.super_type.m_iterator
         )) && ((this->_async_it)._range_it.super_const_iterator._M_current ==
                (it->_async_it)._range_it.super_const_iterator._M_current)) {
    bVar1 = (this->_async_it)._range_end.super_const_iterator._M_current ==
            (it->_async_it)._range_end.super_const_iterator._M_current;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool vloc_edges_iterator_t::operator==(tchecker::syncprod::vloc_edges_iterator_t const & it) const
{
  return ((_sync_it == it._sync_it) && (_async_it == it._async_it));
}